

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O3

ssize_t __thiscall
helics::Endpoint::send(Endpoint *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  Core *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  InvalidFunctionCall *this_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  string_view message;
  
  if ((this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] != (_func_int)0x2)
     && (UNRECOVERED_JUMPTABLE = this->fed->_vptr_MessageFederate[-3],
        UNRECOVERED_JUMPTABLE[(long)&(this->fed->mfManager)._M_t] != (_func_int)0x1)) {
    this_00 = (InvalidFunctionCall *)
              __cxa_allocate_exception
                        (0x28,UNRECOVERED_JUMPTABLE,CONCAT44(in_register_00000034,__fd),__buf,
                         CONCAT44(in_register_00000084,__flags));
    message._M_str = "messages not allowed outside of execution and initialization mode";
    message._M_len = 0x41;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  pCVar1 = (this->super_Interface).mCore;
  UNRECOVERED_JUMPTABLE = pCVar1->_vptr_Core[0x4a];
  iVar2 = (*UNRECOVERED_JUMPTABLE)
                    (pCVar1,(ulong)(uint)(this->super_Interface).handle.hid,
                     CONCAT44(in_register_00000034,__fd),__buf,UNRECOVERED_JUMPTABLE);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

void Endpoint::send(const void* data, size_t data_size) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        mCore->send(handle, data, data_size);
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}